

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O0

void __thiscall
RTree<int,_double,_2,_double,_8,_4>::LoadNodes
          (RTree<int,_double,_2,_double,_8,_4> *this,Node *a_nodeA,Node *a_nodeB,
          PartitionVars *a_parVars)

{
  long in_RCX;
  long in_RDX;
  RTree<int,_double,_2,_double,_8,_4> *in_RSI;
  Node *in_RDI;
  bool nodeWasSplit;
  Node *targetNodes [2];
  int targetNodeIndex;
  int index;
  undefined7 in_stack_ffffffffffffffb0;
  bool bVar1;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  int local_24;
  
  if (in_RSI == (RTree<int,_double,_2,_double,_8,_4> *)0x0) {
    __assert_fail("a_nodeA",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Oxer11[P]Geo-fencing/yourcode/RTree.h"
                  ,0x55d,
                  "void RTree<int, double, 2>::LoadNodes(Node *, Node *, PartitionVars *) [DATATYPE = int, ELEMTYPE = double, NUMDIMS = 2, ELEMTYPEREAL = double, TMAXNODES = 8, TMINNODES = 4]"
                 );
  }
  if (in_RDX != 0) {
    if (in_RCX == 0) {
      __assert_fail("a_parVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Oxer11[P]Geo-fencing/yourcode/RTree.h"
                    ,0x55f,
                    "void RTree<int, double, 2>::LoadNodes(Node *, Node *, PartitionVars *) [DATATYPE = int, ELEMTYPE = double, NUMDIMS = 2, ELEMTYPEREAL = double, TMAXNODES = 8, TMINNODES = 4]"
                   );
    }
    local_24 = 0;
    while( true ) {
      if (*(int *)(in_RCX + 0x24) <= local_24) {
        return;
      }
      bVar1 = true;
      if (*(int *)(in_RCX + (long)local_24 * 4) != 0) {
        bVar1 = *(int *)(in_RCX + (long)local_24 * 4) == 1;
      }
      if (bVar1 == false) break;
      in_stack_ffffffffffffffc7 =
           AddBranch(in_RSI,(Branch *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                     in_RDI,(Node **)CONCAT17(bVar1,in_stack_ffffffffffffffb0));
      if (((in_stack_ffffffffffffffc7 ^ 0xff) & 1) == 0) {
        __assert_fail("!nodeWasSplit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Oxer11[P]Geo-fencing/yourcode/RTree.h"
                      ,0x56a,
                      "void RTree<int, double, 2>::LoadNodes(Node *, Node *, PartitionVars *) [DATATYPE = int, ELEMTYPE = double, NUMDIMS = 2, ELEMTYPEREAL = double, TMAXNODES = 8, TMINNODES = 4]"
                     );
      }
      local_24 = local_24 + 1;
    }
    __assert_fail("a_parVars->m_partition[index] == 0 || a_parVars->m_partition[index] == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Oxer11[P]Geo-fencing/yourcode/RTree.h"
                  ,0x563,
                  "void RTree<int, double, 2>::LoadNodes(Node *, Node *, PartitionVars *) [DATATYPE = int, ELEMTYPE = double, NUMDIMS = 2, ELEMTYPEREAL = double, TMAXNODES = 8, TMINNODES = 4]"
                 );
  }
  __assert_fail("a_nodeB",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Oxer11[P]Geo-fencing/yourcode/RTree.h"
                ,0x55e,
                "void RTree<int, double, 2>::LoadNodes(Node *, Node *, PartitionVars *) [DATATYPE = int, ELEMTYPE = double, NUMDIMS = 2, ELEMTYPEREAL = double, TMAXNODES = 8, TMINNODES = 4]"
               );
}

Assistant:

RTREE_TEMPLATE
void RTREE_QUAL::LoadNodes(Node* a_nodeA, Node* a_nodeB, PartitionVars* a_parVars)
{
  ASSERT(a_nodeA);
  ASSERT(a_nodeB);
  ASSERT(a_parVars);

  for(int index=0; index < a_parVars->m_total; ++index)
  {
    ASSERT(a_parVars->m_partition[index] == 0 || a_parVars->m_partition[index] == 1);

    int targetNodeIndex = a_parVars->m_partition[index];
    Node* targetNodes[] = {a_nodeA, a_nodeB};

    // It is assured that AddBranch here will not cause a node split. 
    bool nodeWasSplit = AddBranch(&a_parVars->m_branchBuf[index], targetNodes[targetNodeIndex], NULL);
    ASSERT(!nodeWasSplit);
  }
}